

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::type_to_array_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t param_2)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  CompilerError *this_00;
  undefined4 in_register_0000000c;
  uint32_t uVar4;
  CompilerGLSL *this_01;
  size_t sVar5;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  if ((((type->pointer == true) && (type->storage == PhysicalStorageBuffer)) &&
      (type->basetype != Struct)) ||
     (sVar3 = (type->array).super_VectorView<unsigned_int>.buffer_size, sVar3 == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"","",CONCAT44(in_register_0000000c,param_2));
  }
  else if ((this->options).flatten_multidimensional_arrays == true) {
    local_58 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar4 = (uint32_t)(type->array).super_VectorView<unsigned_int>.buffer_size;
    if (uVar4 != 0) {
      while( true ) {
        uVar4 = uVar4 - 1;
        this_01 = this;
        to_array_size_abi_cxx11_(&local_50,this,type,uVar4);
        enclose_expression(&local_78,this_01,&local_50);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (uVar4 == 0) break;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    sVar5 = 1;
    if (sVar3 != 1) {
      bVar1 = (this->options).es;
      uVar2 = (this->options).version;
      if (uVar2 < 0x1ae && bVar1 == false) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"GL_ARB_arrays_of_arrays","");
        require_extension_internal(this,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        sVar5 = (type->array).super_VectorView<unsigned_int>.buffer_size;
      }
      else {
        sVar5 = sVar3;
        if ((bVar1 & uVar2 < 0x136) == 1) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Arrays of arrays not supported before ESSL version 310. Try using --flatten-multidimensional-arrays or set options.flatten_multidimensional_arrays to true."
                    );
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    local_58 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar4 = (uint32_t)sVar5;
    while (uVar4 = uVar4 - 1, uVar4 != 0xffffffff) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_array_size_abi_cxx11_(&local_78,this,type,uVar4);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_array_glsl(const SPIRType &type, uint32_t)
{
	if (type.pointer && type.storage == StorageClassPhysicalStorageBufferEXT && type.basetype != SPIRType::Struct)
	{
		// We are using a wrapped pointer type, and we should not emit any array declarations here.
		return "";
	}

	if (type.array.empty())
		return "";

	if (options.flatten_multidimensional_arrays)
	{
		string res;
		res += "[";
		for (auto i = uint32_t(type.array.size()); i; i--)
		{
			res += enclose_expression(to_array_size(type, i - 1));
			if (i > 1)
				res += " * ";
		}
		res += "]";
		return res;
	}
	else
	{
		if (type.array.size() > 1)
		{
			if (!options.es && options.version < 430)
				require_extension_internal("GL_ARB_arrays_of_arrays");
			else if (options.es && options.version < 310)
				SPIRV_CROSS_THROW("Arrays of arrays not supported before ESSL version 310. "
				                  "Try using --flatten-multidimensional-arrays or set "
				                  "options.flatten_multidimensional_arrays to true.");
		}

		string res;
		for (auto i = uint32_t(type.array.size()); i; i--)
		{
			res += "[";
			res += to_array_size(type, i - 1);
			res += "]";
		}
		return res;
	}
}